

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void __thiscall QSslSocket::QSslSocket(QSslSocket *this,QObject *parent)

{
  EVP_PKEY_CTX *ctx;
  QSslSocketPrivate *pQVar1;
  QTcpSocket *in_RSI;
  QSslSocketPrivate *in_RDI;
  QSslSocketPrivate *d;
  QTcpSocketPrivate *in_stack_ffffffffffffffe8;
  
  pQVar1 = in_RDI;
  ctx = (EVP_PKEY_CTX *)operator_new(0x410);
  QSslSocketPrivate::QSslSocketPrivate(pQVar1);
  QTcpSocket::QTcpSocket(in_RSI,in_stack_ffffffffffffffe8,(QObject *)in_RDI);
  *(undefined ***)&(in_RDI->super_QTcpSocketPrivate).super_QAbstractSocketPrivate =
       &PTR_metaObject_004a0500;
  pQVar1 = d_func((QSslSocket *)0x3a034d);
  *(QSslSocketPrivate **)&(pQVar1->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x8 =
       in_RDI;
  QSslSocketPrivate::init(pQVar1,ctx);
  return;
}

Assistant:

QSslSocket::QSslSocket(QObject *parent)
    : QTcpSocket(*new QSslSocketPrivate, parent)
{
    Q_D(QSslSocket);
#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::QSslSocket(" << parent << "), this =" << (void *)this;
#endif
    d->q_ptr = this;
    d->init();
}